

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O1

char * cmTargetPropertyComputer::GetLocation<cmGeneratorTarget>
                 (cmGeneratorTarget *tgt,string *prop,cmMessenger *messenger,
                 cmListFileBacktrace *context)

{
  ulong __n;
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  size_t len;
  string configName;
  string local_50;
  
  TVar2 = cmTarget::GetType(tgt->Target);
  if ((((TVar2 != EXECUTABLE) && (TVar2 = cmTarget::GetType(tgt->Target), TVar2 != STATIC_LIBRARY))
      && (TVar2 = cmTarget::GetType(tgt->Target), TVar2 != SHARED_LIBRARY)) &&
     ((TVar2 = cmTarget::GetType(tgt->Target), TVar2 != MODULE_LIBRARY &&
      (TVar2 = cmTarget::GetType(tgt->Target), TVar2 != UNKNOWN_LIBRARY)))) {
    return (char *)0x0;
  }
  if (GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
      ::propLOCATION_abi_cxx11_ == '\0') {
    GetLocation<cmGeneratorTarget>();
  }
  __n = prop->_M_string_length;
  if ((__n == GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
              ::propLOCATION_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,
                    GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                    ::propLOCATION_abi_cxx11_._M_dataplus._M_p,__n), iVar3 == 0)))) {
    bVar1 = cmTarget::IsImported(tgt->Target);
    if (!bVar1) {
      psVar4 = cmTarget::GetName_abi_cxx11_(tgt->Target);
      bVar1 = HandleLocationPropertyPolicy(psVar4,messenger,context);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    pcVar5 = ComputeLocationForBuild<cmGeneratorTarget>(tgt);
    return pcVar5;
  }
  pcVar5 = (prop->_M_dataplus)._M_p;
  iVar3 = strncmp(pcVar5,"LOCATION_",9);
  if (iVar3 == 0) {
    bVar1 = cmTarget::IsImported(tgt->Target);
    if (!bVar1) {
      psVar4 = cmTarget::GetName_abi_cxx11_(tgt->Target);
      bVar1 = HandleLocationPropertyPolicy(psVar4,messenger,context);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)prop);
    pcVar5 = cmGeneratorTarget::GetLocation(tgt,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      return pcVar5;
    }
    return pcVar5;
  }
  if (__n < 9) {
    return (char *)0x0;
  }
  iVar3 = strcmp(pcVar5 + (__n - 9),"_LOCATION");
  if (iVar3 != 0) {
    return (char *)0x0;
  }
  iVar3 = strncmp(pcVar5,"XCODE_ATTRIBUTE_",0x10);
  if (iVar3 == 0) {
    return (char *)0x0;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + (__n - 9));
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 != 0) {
    bVar1 = cmTarget::IsImported(tgt->Target);
    if (!bVar1) {
      psVar4 = cmTarget::GetName_abi_cxx11_(tgt->Target);
      bVar1 = HandleLocationPropertyPolicy(psVar4,messenger,context);
      if (!bVar1) {
        tgt = (cmGeneratorTarget *)0x0;
        goto LAB_002a7b6a;
      }
    }
    tgt = (cmGeneratorTarget *)cmGeneratorTarget::GetLocation(tgt,&local_50);
  }
LAB_002a7b6a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    return (char *)0x0;
  }
  return (char *)tgt;
}

Assistant:

static const char* GetLocation(Target const* tgt, std::string const& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return nullptr;
        }
        return ComputeLocationForBuild(tgt);
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return nullptr;
        }
        std::string configName = prop.substr(9);
        return ComputeLocation(tgt, configName);
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                            context)) {
            return nullptr;
          }
          return ComputeLocation(tgt, configName);
        }
      }
    }
    return nullptr;
  }